

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heuristics.cpp
# Opt level: O0

int __thiscall Heuristics::evaluateStateBestFirst(Heuristics *this,Table currentState)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int local_20;
  int local_1c;
  int j;
  int i;
  int number;
  int distance;
  Heuristics *this_local;
  
  i = 0;
  for (local_1c = 0; local_1c < 3; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
      cVar1 = Cell::getNumber(currentState.table[local_1c] + local_20);
      if (cVar1 != ' ') {
        cVar1 = Cell::getNumber(currentState.table[local_1c] + local_20);
        iVar2 = local_1c - (cVar1 + -0x31) / 3;
        if (iVar2 < 1) {
          iVar2 = -iVar2;
        }
        iVar3 = local_20 - (cVar1 + -0x31) % 3;
        if (iVar3 < 1) {
          iVar3 = -iVar3;
        }
        i = iVar2 + iVar3 + i;
      }
    }
  }
  return i;
}

Assistant:

int Heuristics::evaluateStateBestFirst(Table currentState) {
    int distance = 0;
    int number = 0;
    for(int i = 0; i < HEIGHT; i++) {
        for (int j = 0; j < WIDTH; j++) {
            if (currentState.table[i][j].getNumber()  != ' ') {
                number = currentState.table[i][j].getNumber() - '0';
                distance += (abs(i - (number-1)/3) + abs(j - (number-1)%3) ) ;
            }
        }
    }
    return distance;
}